

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void __thiscall DPSprite::DPSprite(DPSprite *this,player_t *owner,AActor *caller,int id)

{
  bool bVar1;
  DPSprite *pDVar2;
  AActor *pAVar3;
  DPSprite *local_38;
  DPSprite *next;
  DPSprite *prev;
  int id_local;
  AActor *caller_local;
  player_t *owner_local;
  DPSprite *this_local;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_009fa638;
  this->x = 0.0;
  this->y = 0.0;
  this->oldx = 0.0;
  this->oldy = 0.0;
  this->firstTic = true;
  this->Flags = 0;
  TObjPtr<AActor>::TObjPtr(&this->Caller,caller);
  TObjPtr<DPSprite>::TObjPtr(&this->Next);
  this->Owner = owner;
  this->Sprite = 0;
  this->ID = id;
  this->processPending = true;
  next = (DPSprite *)0x0;
  local_38 = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&this->Owner->psprites);
  while( true ) {
    bVar1 = false;
    if (local_38 != (DPSprite *)0x0) {
      bVar1 = local_38->ID < this->ID;
    }
    if (!bVar1) break;
    next = local_38;
    local_38 = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&local_38->Next);
  }
  TObjPtr<DPSprite>::operator=(&this->Next,local_38);
  GC::WriteBarrier(&this->super_DObject,&local_38->super_DObject);
  if (next == (DPSprite *)0x0) {
    TObjPtr<DPSprite>::operator=(&this->Owner->psprites,this);
    GC::WriteBarrier(&this->super_DObject);
  }
  else {
    TObjPtr<DPSprite>::operator=(&next->Next,this);
    GC::WriteBarrier(&next->super_DObject,&this->super_DObject);
  }
  pDVar2 = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&this->Next);
  if (((pDVar2 != (DPSprite *)0x0) &&
      (pDVar2 = TObjPtr<DPSprite>::operator->(&this->Next), pDVar2->ID == this->ID)) &&
     (this->ID != 0)) {
    pDVar2 = TObjPtr<DPSprite>::operator->(&this->Next);
    (*(pDVar2->super_DObject)._vptr_DObject[4])();
  }
  pAVar3 = TObjPtr<AActor>::operator->(&this->Caller);
  bVar1 = DObject::IsKindOf((DObject *)pAVar3,AWeapon::RegistrationInfo.MyClass);
  if (!bVar1) {
    pAVar3 = TObjPtr<AActor>::operator->(&this->Caller);
    bVar1 = DObject::IsKindOf((DObject *)pAVar3,APlayerPawn::RegistrationInfo.MyClass);
    if (!bVar1) {
      return;
    }
  }
  this->Flags = 0xf;
  return;
}

Assistant:

DPSprite::DPSprite(player_t *owner, AActor *caller, int id)
: x(.0), y(.0),
  oldx(.0), oldy(.0),
  firstTic(true),
  Sprite(0),
  Flags(0),
  Caller(caller),
  Owner(owner),
  ID(id),
  processPending(true)
{
	DPSprite *prev = nullptr;
	DPSprite *next = Owner->psprites;
	while (next != nullptr && next->ID < ID)
	{
		prev = next;
		next = next->Next;
	}
	Next = next;
	GC::WriteBarrier(this, next);
	if (prev == nullptr)
	{
		Owner->psprites = this;
		GC::WriteBarrier(this);
	}
	else
	{
		prev->Next = this;
		GC::WriteBarrier(prev, this);
	}

	if (Next && Next->ID == ID && ID != 0)
		Next->Destroy(); // Replace it.

	if (Caller->IsKindOf(RUNTIME_CLASS(AWeapon)) || Caller->IsKindOf(RUNTIME_CLASS(APlayerPawn)))
		Flags = (PSPF_ADDWEAPON|PSPF_ADDBOB|PSPF_POWDOUBLE|PSPF_CVARFAST);
}